

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::update_marginal(data *sm,example *ec)

{
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  int __c;
  int __c_00;
  long in_RSI;
  iterator *rhs;
  features_value_iterator *rhs_00;
  long in_RDI;
  float fVar4;
  float fVar5;
  double dVar6;
  float regret2;
  float regret1;
  expert_pair *e;
  marginal *m;
  uint64_t key;
  uint64_t second_index;
  iterator j;
  namespace_index n;
  iterator i;
  float weight;
  float label;
  uint64_t mask;
  vw *all;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  example_predict *in_stack_ffffffffffffff50;
  features *in_stack_ffffffffffffff68;
  features_value_iterator local_80 [2];
  features_value_iterator local_70 [2];
  features_value_index_iterator local_60;
  undefined1 local_49;
  iterator local_48;
  iterator local_38;
  float local_28;
  undefined4 local_24;
  uint64_t local_20;
  undefined8 *local_18;
  long local_10;
  long local_8;
  
  local_18 = *(undefined8 **)(in_RDI + 0x6998);
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = parameters::mask((parameters *)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_24 = *(undefined4 *)(local_10 + 0x6828);
  local_28 = *(float *)(local_10 + 0x6870);
  if ((*(byte *)(local_8 + 0xd) & 1) != 0) {
    local_28 = 1.0;
  }
  local_38 = example_predict::begin(in_stack_ffffffffffffff50);
  do {
    local_48 = example_predict::end(in_stack_ffffffffffffff50);
    rhs = &local_48;
    bVar1 = example_predict::iterator::operator!=(&local_38,rhs);
    if (!bVar1) {
      return;
    }
    pcVar2 = example_predict::iterator::index(&local_38,(char *)rhs,__c);
    local_49 = SUB81(pcVar2,0);
    if ((*(byte *)(local_8 + 0xe + ((ulong)pcVar2 & 0xff)) & 1) != 0) {
      features::begin(in_stack_ffffffffffffff68);
      while( true ) {
        features::end(in_stack_ffffffffffffff68);
        bVar1 = features_value_iterator::operator!=
                          (&local_60.super_features_value_iterator,local_70);
        if (!bVar1) break;
        in_stack_ffffffffffffff50 =
             (example_predict *)
             features_value_index_iterator::operator++
                       ((features_value_index_iterator *)in_stack_ffffffffffffff50);
        features::end(in_stack_ffffffffffffff68);
        rhs_00 = local_80;
        bVar1 = features_value_iterator::operator==
                          ((features_value_iterator *)in_stack_ffffffffffffff50,rhs_00);
        if (bVar1) break;
        features_value_index_iterator::index(&local_60,(char *)rhs_00,__c_00);
        in_stack_ffffffffffffff68 =
             (features *)
             std::
             unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                           *)in_stack_ffffffffffffff50,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
        if ((*(byte *)(local_8 + 0x6948) & 1) != 0) {
          pmVar3 = std::
                   unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                   ::operator[]((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                 *)in_stack_ffffffffffffff50,
                                (key_type *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          in_stack_ffffffffffffff48 = *(float *)(local_8 + 0x695c);
          dVar6 = (double)(in_stack_ffffffffffffff68->values)._begin /
                  (double)(in_stack_ffffffffffffff68->values)._end;
          fVar4 = (float)(**(code **)(*(long *)local_18[0x6a9] + 8))
                                   (CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6),local_24,
                                    (long *)local_18[0x6a9],*local_18);
          fVar4 = in_stack_ffffffffffffff48 - fVar4;
          in_stack_ffffffffffffff4c = *(float *)(local_8 + 0x695c);
          fVar5 = (float)(**(code **)(*(long *)local_18[0x6a9] + 8))
                                   (*(undefined4 *)(local_8 + 0x694c),local_24,
                                    (long *)local_18[0x6a9],*local_18);
          fVar5 = in_stack_ffffffffffffff4c - fVar5;
          (pmVar3->first).regret = fVar4 * local_28 + (pmVar3->first).regret;
          (pmVar3->first).abs_regret = fVar4 * fVar4 * local_28 + (pmVar3->first).abs_regret;
          fVar4 = get_adanormalhedge_weights
                            (SUB84(in_stack_ffffffffffffff50,0),in_stack_ffffffffffffff4c);
          (pmVar3->first).weight = fVar4;
          (pmVar3->second).regret = fVar5 * local_28 + (pmVar3->second).regret;
          (pmVar3->second).abs_regret = fVar5 * fVar5 * local_28 + (pmVar3->second).abs_regret;
          fVar4 = get_adanormalhedge_weights
                            (SUB84(in_stack_ffffffffffffff50,0),in_stack_ffffffffffffff4c);
          (pmVar3->second).weight = fVar4;
        }
        (in_stack_ffffffffffffff68->values)._begin =
             (float *)((double)(in_stack_ffffffffffffff68->values)._begin *
                       (1.0 - (double)*(float *)(local_8 + 8)) +
                      (double)(*(float *)(local_10 + 0x6828) * local_28));
        (in_stack_ffffffffffffff68->values)._end =
             (float *)((double)(in_stack_ffffffffffffff68->values)._end *
                       (1.0 - (double)*(float *)(local_8 + 8)) + (double)local_28);
        features_value_index_iterator::operator++
                  ((features_value_index_iterator *)in_stack_ffffffffffffff50);
      }
    }
    example_predict::iterator::operator++(&local_38);
  } while( true );
}

Assistant:

void update_marginal(data& sm, example& ec)
{
  vw& all = *sm.all;
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  float weight = ec.weight;
  if (sm.unweighted_marginals)
    weight = 1.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        if (++j == sm.temp[n].end())
          break;

        uint64_t second_index = j.index() & mask;
        uint64_t key = second_index + ec.ft_offset;
        marginal& m = sm.marginals[key];

        if (sm.compete)  // now update weights, before updating marginals
        {
          expert_pair& e = sm.expert_state[key];
          float regret1 = sm.alg_loss - all.loss->getLoss(all.sd, (float)(m.first / m.second), label);
          float regret2 = sm.alg_loss - all.loss->getLoss(all.sd, sm.feature_pred, label);

          e.first.regret += regret1 * weight;
          e.first.abs_regret += regret1 * regret1 * weight;  // fabs(regret1);
          e.first.weight = get_adanormalhedge_weights(e.first.regret, e.first.abs_regret);
          e.second.regret += regret2 * weight;
          e.second.abs_regret += regret2 * regret2 * weight;  // fabs(regret2);
          e.second.weight = get_adanormalhedge_weights(e.second.regret, e.second.abs_regret);
        }

        m.first = m.first * (1. - sm.decay) + ec.l.simple.label * weight;
        m.second = m.second * (1. - sm.decay) + weight;
      }
  }
}